

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

bool anon_unknown.dwarf_b576ef::CompileDeferred
               (TCompiler *compiler,char **shaderStrings,int numStrings,int *inputLengths,
               char **stringNames,char *preamble,EShOptimizationLevel optLevel,
               TBuiltInResource *resources,int defaultVersion,EProfile defaultProfile,
               bool forceDefaultVersionAndProfile,int overrideVersion,bool forwardCompatible,
               EShMessages messages,TIntermediate *intermediate,Includer *includer,
               string sourceEntryPointName,TEnvironment *environment,bool compileOnly)

{
  int *piVar1;
  TInfoSink *pTVar2;
  TSymbolTable *symTable;
  SpvVersion spvVersion_00;
  string sourceEntryPointName_00;
  EProfile profile_00;
  unique_ptr<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_> symbolTable_00;
  EShSource source;
  bool bVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  TPoolAllocator *this;
  size_t *L;
  char **s;
  char **names;
  size_t sVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar10;
  TInfoSinkBase *pTVar8;
  TParseContextBase *pc;
  size_t sVar9;
  long lVar11;
  ulong uVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  undefined2 uStack_628;
  bool local_626;
  bool versionNotFirstToken;
  int version;
  EProfile profile;
  undefined4 uStack_61c;
  undefined8 local_618;
  EShMessages local_60c;
  ulong local_608;
  unique_ptr<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_> symbolTable;
  char local_5f4;
  SpvVersion spvVersion;
  EShLanguage stage;
  char *local_5b0;
  ulong local_5a8;
  string local_5a0;
  EShSource sourceGuess;
  uint local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  bool local_568;
  undefined3 uStack_567;
  string preamble_1;
  long *local_538 [2];
  long local_528 [2];
  TSourceLoc loc;
  TSourceLoc *local_4e8;
  TScanContext scanContext;
  TInputScanner userInput;
  TPpContext ppContext;
  
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  local_618 = stringNames;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a0,*(long *)sourceEntryPointName._M_dataplus._M_p,
             *(long *)(sourceEntryPointName._M_dataplus._M_p + 8) +
             *(long *)sourceEntryPointName._M_dataplus._M_p);
  local_60c = messages;
  this = glslang::GetThreadPoolAllocator();
  glslang::TPoolAllocator::push(this);
  if (numStrings == 0) {
    cVar5 = '\x01';
  }
  else {
    uVar12 = 0xffffffffffffffff;
    if (-4 < numStrings) {
      uVar12 = (long)numStrings * 8 + 0x18;
    }
    local_5b0 = preamble;
    L = (size_t *)operator_new__(uVar12);
    s = (char **)operator_new__(uVar12);
    names = (char **)operator_new__(uVar12);
    uVar12 = (ulong)(uint)numStrings;
    local_608 = (ulong)(uint)numStrings;
    if (0 < numStrings) {
      uVar15 = 0;
      do {
        pcVar14 = shaderStrings[uVar15];
        s[uVar15 + 2] = pcVar14;
        if ((inputLengths == (int *)0x0) || (sVar7 = (size_t)inputLengths[uVar15], (long)sVar7 < 0))
        {
          sVar7 = strlen(pcVar14);
        }
        L[uVar15 + 2] = sVar7;
        uVar15 = uVar15 + 1;
      } while (uVar12 != uVar15);
    }
    if (local_618 == (char **)0x0) {
      if (0 < (int)local_608) {
        memset(names + 2,0,uVar12 * 8);
      }
    }
    else if (0 < (int)local_608) {
      memcpy(names + 2,local_618,uVar12 * 8);
    }
    sourceGuess = EShSourceHlsl - ((messages & EShMsgReadHlsl) == EShMsgDefault);
    spvVersion.spv = 0;
    spvVersion.vulkanGlsl = 0;
    spvVersion.vulkan = 0;
    spvVersion.openGl = 0;
    spvVersion._16_4_ = spvVersion._16_4_ & 0xffffff00;
    stage = compiler->language;
    TranslateEnvironment
              ((TEnvironment *)sourceEntryPointName._M_string_length,&local_60c,&sourceGuess,&stage,
               &spvVersion);
    source = sourceGuess;
    if ((sourceEntryPointName._M_string_length != 0) &&
       (*(char *)(sourceEntryPointName._M_string_length + 0x24) == '\x01')) {
      intermediate->hlslFunctionality1 = true;
    }
    glslang::TInputScanner::TInputScanner
              (&userInput,(int)local_608,s + 2,L + 2,(char **)0x0,0,0,false);
    version = 0;
    profile = ENoProfile;
    versionNotFirstToken = false;
    bVar3 = true;
    uVar10 = extraout_var;
    if (source != EShSourceHlsl) {
      bVar3 = glslang::TInputScanner::scanVersion
                        (&userInput,&version,&profile,&versionNotFirstToken);
      uVar10 = extraout_var_00;
    }
    iVar13 = version;
    local_618._0_4_ = (EShMessages)CONCAT71(uVar10,version == 0);
    if (forceDefaultVersionAndProfile && source == EShSourceGlsl) {
      if (((local_60c & EShMsgSuppressWarnings) == EShMsgDefault && version != 0) &&
         ((version != defaultVersion || (profile != defaultProfile)))) {
        pTVar2 = compiler->infoSink;
        glslang::TInfoSinkBase::append(&pTVar2->info,"Warning, (version, profile) forced to be (");
        pTVar8 = glslang::TInfoSinkBase::operator<<(&pTVar2->info,defaultVersion);
        glslang::TInfoSinkBase::append(pTVar8,", ");
        pcVar14 = "unknown profile";
        if (defaultProfile - ENoProfile < 8) {
          pcVar14 = (char *)(&DAT_0093ac50)[defaultProfile - ENoProfile];
        }
        glslang::TInfoSinkBase::append(pTVar8,pcVar14);
        glslang::TInfoSinkBase::append(pTVar8,"), while in source code it is (");
        pTVar8 = glslang::TInfoSinkBase::operator<<(pTVar8,version);
        glslang::TInfoSinkBase::append(pTVar8,", ");
        pcVar14 = "unknown profile";
        if (profile - ENoProfile < 8) {
          pcVar14 = (char *)(&DAT_0093ac50)[profile - ENoProfile];
        }
        glslang::TInfoSinkBase::append(pTVar8,pcVar14);
        glslang::TInfoSinkBase::append(pTVar8,")\n");
      }
      if (iVar13 == 0) {
        versionNotFirstToken = false;
        bVar3 = false;
        local_618._0_4_ = 0;
      }
      version = defaultVersion;
      profile = defaultProfile;
    }
    if (overrideVersion != 0 && source == EShSourceGlsl) {
      version = overrideVersion;
    }
    uVar15 = (ulong)stage;
    bVar4 = DeduceVersionProfile
                      (compiler->infoSink,stage,bVar3,defaultVersion,source,&version,&profile,
                       &spvVersion);
    local_626 = true;
    if ((char)local_618 == '\0') {
      local_626 = (bool)((299 < version && profile == EEsProfile) & bVar3);
    }
    uStack_61c = CONCAT13(bVar4,(undefined3)uStack_61c);
    if (local_626 == false) {
      if (versionNotFirstToken == true) {
        local_5f4 = (char)(local_60c & EShMsgRelaxedErrors);
        local_626 = (local_60c & EShMsgRelaxedErrors) == EShMsgDefault;
      }
      else {
        local_5f4 = '\0';
      }
    }
    else {
      local_5f4 = '\0';
    }
    intermediate->source = source;
    intermediate->version = version;
    intermediate->profile = profile;
    local_5a8 = uVar15;
    glslang::TIntermediate::setSpv(intermediate,&spvVersion);
    local_618._0_4_ = local_60c;
    RecordProcesses(intermediate,local_60c,&local_5a0);
    if (0 < spvVersion.vulkan) {
      intermediate->originUpperLeft = true;
    }
    if (source == EShSourceHlsl || ((EShMessages)local_618 >> 9 & 1) != 0) {
      intermediate->hlslOffsets = true;
      glslang::TProcesses::addProcess(&intermediate->processes,"hlsl-offsets");
    }
    if (((EShMessages)local_618 >> 10 & 1) != 0) {
      glslang::TIntermediate::setSourceFile(intermediate,names[2]);
      if (0 < (int)local_608) {
        uVar15 = 0;
        do {
          std::__cxx11::string::append((char *)&intermediate->sourceText,(ulong)s[uVar15 + 2]);
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
    }
    bVar3 = SetupBuiltinSymbolTable(version,profile,&spvVersion,source);
    if (bVar3) {
      uVar6 = MapVersionToIndex(version);
      uVar12 = local_5a8;
      uVar15 = 1;
      if (spvVersion.openGl < 1) {
        if (spvVersion.vulkan < 1) {
          uVar15 = 0;
        }
        else {
          uVar15 = (ulong)spvVersion.vulkanRelaxed | 2;
        }
      }
      if (profile - ECoreProfile < 7) {
        lVar11 = *(long *)(&DAT_006ff018 + (ulong)(profile - ECoreProfile) * 8);
      }
      else {
        lVar11 = 0;
      }
      symTable = (TSymbolTable *)
                 (&(anonymous_namespace)::SharedSymbolTables)
                 [uVar15 * 0x70 +
                  lVar11 * 0x1c +
                  (ulong)(source == EShSourceHlsl) * 0xe + (ulong)uVar6 * 0x1c0 + local_5a8];
      symbolTable._M_t.
      super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>._M_t
      .super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>.
      super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl =
           (__uniq_ptr_data<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>,_true,_true>
            )operator_new(0x28);
      *(uint *)((long)symbolTable._M_t.
                      super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                      .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x24) =
           0;
      *(undefined8 *)
       symbolTable._M_t.
       super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>.
       _M_t.
       super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>.
       super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl = 0;
      *(pointer *)
       ((long)symbolTable._M_t.
              super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
              ._M_t.
              super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
              .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 8) =
           (pointer)0x0;
      *(pointer *)
       ((long)symbolTable._M_t.
              super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
              ._M_t.
              super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
              .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x10) =
           (pointer)0x0;
      *(longlong *)
       ((long)symbolTable._M_t.
              super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
              ._M_t.
              super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
              .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x18) = 0;
      *(undefined2 *)
       ((long)symbolTable._M_t.
              super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
              ._M_t.
              super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
              .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x20) = 0;
      if (symTable != (TSymbolTable *)0x0) {
        glslang::TSymbolTable::adoptLevels
                  ((TSymbolTable *)
                   symbolTable._M_t.
                   super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                   .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl,symTable);
      }
      if (intermediate->uniqueId != 0) {
        uVar6 = (int)((ulong)(*(long *)((long)symbolTable._M_t.
                                              super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                                              .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>
                                              ._M_head_impl + 8) -
                             *(long *)symbolTable._M_t.
                                      super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                                      .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>.
                                      _M_head_impl) >> 3) - 1;
        uVar15 = 0x7f00000000000000;
        if (uVar6 < 0x80) {
          uVar15 = (ulong)uVar6 << 0x38;
        }
        *(unsigned_long_long *)
         ((long)symbolTable._M_t.
                super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                ._M_t.
                super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x18) =
             intermediate->uniqueId & 0xffffffffffffff | uVar15;
      }
      bVar3 = AddContextSpecificSymbols
                        (resources,compiler->infoSink,
                         (TSymbolTable *)
                         symbolTable._M_t.
                         super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                         .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl,version
                         ,profile,&spvVersion,(EShLanguage)uVar12,source);
      if (bVar3) {
        if (((EShMessages)local_618 >> 0xe & 1) != 0) {
          DumpBuiltinSymbolTable
                    (compiler->infoSink,
                     (TSymbolTable *)
                     symbolTable._M_t.
                     super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                     .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl);
        }
        symbolTable_00._M_t.
        super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>.
        _M_t.
        super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
        .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl =
             symbolTable._M_t.
             super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
             ._M_t.
             super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
             .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl;
        profile_00 = profile;
        iVar13 = version;
        pTVar2 = compiler->infoSink;
        local_578 = spvVersion.spv;
        iStack_574 = spvVersion.vulkanGlsl;
        iStack_570 = spvVersion.vulkan;
        iStack_56c = spvVersion.openGl;
        local_568 = spvVersion.vulkanRelaxed;
        uStack_567 = spvVersion._17_3_;
        local_538[0] = local_528;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,local_5a0._M_dataplus._M_p,
                   local_5a0._M_dataplus._M_p + local_5a0._M_string_length);
        spvVersion_00.vulkanGlsl = iStack_574;
        spvVersion_00.spv = local_578;
        spvVersion_00.openGl = iStack_56c;
        spvVersion_00.vulkan = iStack_570;
        spvVersion_00.vulkanRelaxed = local_568;
        spvVersion_00._17_3_ = uStack_567;
        sourceEntryPointName_00._M_string_length._0_2_ = uStack_628;
        sourceEntryPointName_00._M_dataplus._M_p = (pointer)local_538;
        sourceEntryPointName_00._M_string_length._2_1_ = local_626;
        sourceEntryPointName_00._M_string_length._3_1_ = versionNotFirstToken;
        sourceEntryPointName_00._M_string_length._4_4_ = version;
        sourceEntryPointName_00.field_2._M_allocated_capacity._0_4_ = profile;
        sourceEntryPointName_00.field_2._M_allocated_capacity._4_4_ = uStack_61c;
        sourceEntryPointName_00.field_2._8_4_ = (EShMessages)local_618;
        sourceEntryPointName_00.field_2._12_4_ = local_618._4_4_;
        pc = CreateParseContext((TSymbolTable *)
                                symbolTable_00._M_t.
                                super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                                .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl,
                                intermediate,iVar13,profile_00,source,(EShLanguage)uVar12,pTVar2,
                                spvVersion_00,forwardCompatible,(EShMessages)local_618,false,
                                sourceEntryPointName_00);
        if (local_538[0] != local_528) {
          operator_delete(local_538[0],local_528[0] + 1);
        }
        pc->compileOnly = (bool)sourceEntryPointName.field_2._M_local_buf[0];
        pcVar14 = "";
        if (names[2] != (char *)0x0) {
          pcVar14 = names[2];
        }
        loc.name = (TString *)&loc.column;
        sVar9 = strlen(pcVar14);
        std::__cxx11::string::_M_construct<char_const*>((string *)&loc,pcVar14,pcVar14 + sVar9);
        glslang::TPpContext::TPpContext(&ppContext,pc,(string *)&loc,includer);
        if (loc.name != (TString *)&loc.column) {
          operator_delete(loc.name,CONCAT44(loc._20_4_,loc.column) + 1);
        }
        scanContext._vptr_TScanContext = (_func_int **)&PTR__TScanContext_0093acc0;
        scanContext.afterType = false;
        scanContext.afterStruct = false;
        scanContext.field = false;
        scanContext.afterBuffer = false;
        if (source == EShSourceGlsl) {
          pc->scanContext = &scanContext;
        }
        pc->ppContext = &ppContext;
        scanContext.parseContext = pc;
        (*(pc->super_TParseVersions)._vptr_TParseVersions[0x31])(pc,resources);
        if (uStack_61c._3_1_ == '\0') {
          piVar1 = &(pc->super_TParseVersions).numErrors;
          *piVar1 = *piVar1 + 1;
        }
        iVar13 = (int)local_608 + 2;
        local_608 = (ulong)((int)local_608 + 3);
        if (local_5f4 != '\0') {
          loc.name = (TString *)0x0;
          loc.string = 0;
          loc.line = 0;
          loc.column = 0;
          (*(pc->super_TParseVersions)._vptr_TParseVersions[0x2e])
                    (pc,&loc,"Illegal to have non-comment, non-whitespace tokens before #version",
                     "#version","");
        }
        (*(pc->super_TParseVersions)._vptr_TParseVersions[2])(pc);
        preamble_1._M_dataplus._M_p = (pointer)&preamble_1.field_2;
        preamble_1._M_string_length = 0;
        preamble_1.field_2._M_local_buf[0] = '\0';
        glslang::TParseVersions::getPreamble(&pc->super_TParseVersions,&preamble_1);
        *s = preamble_1._M_dataplus._M_p;
        sVar9 = strlen(preamble_1._M_dataplus._M_p);
        *L = sVar9;
        *names = (char *)0x0;
        s[1] = local_5b0;
        sVar9 = strlen(local_5b0);
        L[1] = sVar9;
        names[1] = (char *)0x0;
        s[iVar13] = "\n int;";
        L[iVar13] = 6;
        names[iVar13] = (char *)0x0;
        glslang::TInputScanner::TInputScanner
                  ((TInputScanner *)&loc,(int)local_608,s,L,names,2,1,false);
        glslang::TSymbolTable::push
                  ((TSymbolTable *)
                   symbolTable._M_t.
                   super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                   .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl);
        iVar13 = (*(pc->super_TParseVersions)._vptr_TParseVersions[0x3b])
                           (pc,&ppContext,(TInputScanner *)&loc,(ulong)local_626);
        cVar5 = (char)iVar13;
        if (cVar5 == '\0') {
          glslang::TInfoSinkBase::append(&((pc->super_TParseVersions).infoSink)->info,"ERROR: ");
          pTVar8 = glslang::TInfoSinkBase::operator<<
                             (&((pc->super_TParseVersions).infoSink)->info,
                              (pc->super_TParseVersions).numErrors);
          glslang::TInfoSinkBase::append(pTVar8," compilation errors.  No code generated.\n\n");
        }
        else if (intermediate->treeRoot != (TIntermNode *)0x0) {
          if (optLevel == EShOptNoGeneration) {
            glslang::TInfoSinkBase::message
                      (&((pc->super_TParseVersions).infoSink)->info,EPrefixNone,
                       "No errors.  No code generation or linking was requested.");
          }
          else {
            cVar5 = glslang::TIntermediate::postProcess
                              (intermediate,intermediate->treeRoot,
                               (pc->super_TParseVersions).language);
          }
        }
        if (((EShMessages)local_618 & EShMsgAST) != EShMsgDefault) {
          glslang::TIntermediate::output(intermediate,(pc->super_TParseVersions).infoSink,true);
        }
        intermediate->uniqueId =
             *(unsigned_long_long *)
              ((long)symbolTable._M_t.
                     super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                     .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x18);
        loc.name = (TString *)&PTR__TInputScanner_0093aca0;
        if (local_4e8 != (TSourceLoc *)0x0) {
          operator_delete__(local_4e8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)preamble_1._M_dataplus._M_p != &preamble_1.field_2) {
          operator_delete(preamble_1._M_dataplus._M_p,
                          CONCAT71(preamble_1.field_2._M_allocated_capacity._1_7_,
                                   preamble_1.field_2._M_local_buf[0]) + 1);
        }
        glslang::TPpContext::~TPpContext(&ppContext);
        (*(pc->super_TParseVersions)._vptr_TParseVersions[1])(pc);
      }
      else {
        cVar5 = '\0';
      }
      std::unique_ptr<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>::
      ~unique_ptr(&symbolTable);
    }
    else {
      cVar5 = '\0';
    }
    userInput._vptr_TInputScanner = (_func_int **)&PTR__TInputScanner_0093aca0;
    if (userInput.loc != (TSourceLoc *)0x0) {
      operator_delete__(userInput.loc);
    }
    operator_delete__(names);
    operator_delete__(s);
    operator_delete__(L);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  return (bool)cVar5;
}

Assistant:

bool CompileDeferred(
    TCompiler* compiler,
    const char* const shaderStrings[],
    const int numStrings,
    const int* inputLengths,
    const char* const stringNames[],
    const char* preamble,
    const EShOptimizationLevel optLevel,
    const TBuiltInResource* resources,
    int defaultVersion,         // use 100 for ES environment, 110 for desktop
    EProfile defaultProfile,
    bool forceDefaultVersionAndProfile,
    int overrideVersion,        // use 0 if not overriding GLSL version
    bool forwardCompatible,     // give errors for use of deprecated features
    EShMessages messages,       // warnings/errors/AST; things to print out
    TIntermediate& intermediate,// returned tree, etc.
    TShader::Includer& includer,
    const std::string sourceEntryPointName = "",
    TEnvironment* environment = nullptr,
    bool compileOnly = false)
{
    DoFullParse parser;
    return ProcessDeferred(compiler, shaderStrings, numStrings, inputLengths, stringNames,
                           preamble, optLevel, resources, defaultVersion,
                           defaultProfile, forceDefaultVersionAndProfile, overrideVersion,
                           forwardCompatible, messages, intermediate, parser,
                           true, includer, sourceEntryPointName, environment, compileOnly);
}